

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_rerolled_array_expression
          (CompilerGLSL *this,SPIRType *parent_type,string *base_expr,SPIRType *type)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  SPIRType *in_R8;
  bool local_249;
  undefined1 local_248 [64];
  spirv_cross local_208 [32];
  spirv_cross local_1e8 [32];
  undefined1 local_1c8 [8];
  string subexpr;
  uint local_1a8;
  allocator local_1a2;
  char local_1a1;
  uint32_t i;
  SPIRType *parent;
  uint32_t size;
  undefined1 local_188 [8];
  SPIRType tmp_type;
  bool remapped_boolean;
  SPIRType *type_local;
  string *base_expr_local;
  SPIRType *parent_type_local;
  CompilerGLSL *this_local;
  string *expr;
  
  local_249 = false;
  if ((*(int *)(base_expr + 0xc) == 0xf) &&
     (local_249 = false, *(int *)&(in_R8->super_IVariant).field_0xc == 2)) {
    local_249 = parent_type[0x18].member_name_cache._M_h._M_rehash_policy._M_max_load_factor !=
                2.8026e-45;
  }
  tmp_type.member_name_cache._M_h._M_single_bucket._7_1_ = local_249;
  SPIRType::SPIRType((SPIRType *)local_188);
  if ((tmp_type.member_name_cache._M_h._M_single_bucket._7_1_ & 1) == 0) {
    if ((*(int *)&(in_R8->super_IVariant).field_0xc == 2) &&
       (parent_type[0x18].member_name_cache._M_h._M_rehash_policy._M_max_load_factor != 2.8026e-45))
    {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&in_R8->parent_type);
      pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)parent_type,uVar2);
      SPIRType::operator=((SPIRType *)local_188,pSVar3);
      tmp_type.member_name_cache._M_h._M_single_bucket._7_1_ = 1;
    }
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&in_R8->parent_type);
    pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)parent_type,uVar2);
    SPIRType::operator=((SPIRType *)local_188,pSVar3);
    tmp_type.super_IVariant._vptr_IVariant._4_4_ =
         parent_type[0x18].member_name_cache._M_h._M_rehash_policy._M_max_load_factor;
  }
  parent._0_4_ = to_array_size_literal((CompilerGLSL *)parent_type,in_R8);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&in_R8->parent_type);
  _i = Compiler::get<spirv_cross::SPIRType>((Compiler *)parent_type,uVar2);
  local_1a1 = '\0';
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)this,"{ ",&local_1a2);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1a2);
  for (local_1a8 = 0; local_1a8 < (uint32_t)parent; local_1a8 = local_1a8 + 1) {
    convert_to_string<unsigned_int,_0>(local_1e8,&local_1a8);
    join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              ((spirv_cross *)local_1c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type,
               (char (*) [2])0x5ee639,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
               (char (*) [2])0x5ee53e);
    ::std::__cxx11::string::~string((string *)local_1e8);
    bVar1 = Compiler::type_is_top_level_array((Compiler *)parent_type,_i);
    if (bVar1) {
      to_rerolled_array_expression
                ((CompilerGLSL *)local_248,parent_type,base_expr,(SPIRType *)local_1c8);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_248);
      ::std::__cxx11::string::~string((string *)local_248);
    }
    else {
      if ((tmp_type.member_name_cache._M_h._M_single_bucket._7_1_ & 1) != 0) {
        (*(parent_type->super_IVariant)._vptr_IVariant[0x13])
                  (local_248 + 0x20,parent_type,local_188,0);
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  (local_208,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_248 + 0x20),(char (*) [2])0x601bd3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                   (char (*) [2])0x5eaa1a);
        ::std::__cxx11::string::operator=((string *)local_1c8,(string *)local_208);
        ::std::__cxx11::string::~string((string *)local_208);
        ::std::__cxx11::string::~string((string *)(local_248 + 0x20));
      }
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_1c8);
    }
    if (local_1a8 + 1 < (uint32_t)parent) {
      ::std::__cxx11::string::operator+=((string *)this,", ");
    }
    ::std::__cxx11::string::~string((string *)local_1c8);
  }
  ::std::__cxx11::string::operator+=((string *)this," }");
  local_1a1 = '\x01';
  SPIRType::~SPIRType((SPIRType *)local_188);
  return this;
}

Assistant:

string CompilerGLSL::to_rerolled_array_expression(const SPIRType &parent_type,
                                                  const string &base_expr, const SPIRType &type)
{
	bool remapped_boolean = parent_type.basetype == SPIRType::Struct &&
	                        type.basetype == SPIRType::Boolean &&
	                        backend.boolean_in_struct_remapped_type != SPIRType::Boolean;

	SPIRType tmp_type;
	if (remapped_boolean)
	{
		tmp_type = get<SPIRType>(type.parent_type);
		tmp_type.basetype = backend.boolean_in_struct_remapped_type;
	}
	else if (type.basetype == SPIRType::Boolean && backend.boolean_in_struct_remapped_type != SPIRType::Boolean)
	{
		// It's possible that we have an r-value expression that was OpLoaded from a struct.
		// We have to reroll this and explicitly cast the input to bool, because the r-value is short.
		tmp_type = get<SPIRType>(type.parent_type);
		remapped_boolean = true;
	}

	uint32_t size = to_array_size_literal(type);
	auto &parent = get<SPIRType>(type.parent_type);
	string expr = "{ ";

	for (uint32_t i = 0; i < size; i++)
	{
		auto subexpr = join(base_expr, "[", convert_to_string(i), "]");
		if (!type_is_top_level_array(parent))
		{
			if (remapped_boolean)
				subexpr = join(type_to_glsl(tmp_type), "(", subexpr, ")");
			expr += subexpr;
		}
		else
			expr += to_rerolled_array_expression(parent_type, subexpr, parent);

		if (i + 1 < size)
			expr += ", ";
	}

	expr += " }";
	return expr;
}